

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

void RestartModel(CPpmd7 *p)

{
  CPpmd7_Context *pCVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  Byte *pBVar5;
  ulong uVar6;
  UInt16 (*paUVar7) [64];
  Byte *pBVar8;
  CPpmd_State *pCVar9;
  ulong uVar10;
  uint uVar11;
  UInt16 (*paUVar12) [64];
  long lVar13;
  long lVar14;
  
  lVar14 = 0;
  memset(p->FreeList,0,0x98);
  pBVar5 = p->Base;
  uVar3 = p->AlignOffset;
  pBVar8 = pBVar5 + uVar3;
  p->Text = pBVar8;
  uVar4 = p->MaxOrder;
  uVar6 = (ulong)p->Size;
  uVar10 = (ulong)((p->Size / 0x60) * 0x54);
  pCVar9 = (CPpmd_State *)(pBVar8 + (uVar6 - uVar10));
  p->UnitsStart = (Byte *)pCVar9;
  p->GlueCount = 0;
  p->OrderFall = uVar4;
  uVar11 = 0xc;
  if (uVar4 < 0xc) {
    uVar11 = uVar4;
  }
  p->InitRL = ~uVar11;
  p->RunLength = ~uVar11;
  p->PrevSuccess = 0;
  pCVar1 = (CPpmd7_Context *)(pBVar8 + (uVar6 - 0xc));
  p->HiUnit = (Byte *)pCVar1;
  p->MaxContext = pCVar1;
  p->MinContext = pCVar1;
  pCVar1->Suffix = 0;
  pCVar1->NumStats = 0x100;
  pCVar1->SummFreq = 0x101;
  p->FoundState = pCVar9;
  p->LoUnit = &pCVar9[0x100].Symbol;
  pCVar1->Stats = (int)pCVar9 - (int)pBVar5;
  pBVar5 = pBVar5 + ((uVar6 + uVar3) - uVar10) + 4;
  do {
    pBVar5[-4] = (Byte)lVar14;
    pBVar5[-3] = '\x01';
    pBVar5[-2] = '\0';
    pBVar5[-1] = '\0';
    pBVar5[0] = '\0';
    pBVar5[1] = '\0';
    lVar14 = lVar14 + 1;
    pBVar5 = pBVar5 + 6;
  } while (lVar14 != 0x100);
  paUVar7 = p->BinSumm;
  lVar14 = 0;
  do {
    lVar13 = 0;
    paUVar12 = paUVar7;
    do {
      uVar2 = kInitBinEsc[lVar13];
      uVar6 = 0xfffffffffffffff8;
      do {
        (*paUVar12)[uVar6 + 8] = 0x4000 - (short)((uint)uVar2 / ((int)lVar14 + 2U));
        uVar6 = uVar6 + 8;
      } while (uVar6 < 0x38);
      lVar13 = lVar13 + 1;
      paUVar12 = (UInt16 (*) [64])(*paUVar12 + 1);
    } while (lVar13 != 8);
    lVar14 = lVar14 + 1;
    paUVar7 = paUVar7 + 1;
  } while (lVar14 != 0x80);
  pBVar8 = &p->See[0][0].Count;
  lVar14 = 0;
  do {
    lVar13 = 0;
    do {
      *(undefined2 *)(pBVar8 + lVar13 * 4 + -1) = 0x403;
      *(short *)(pBVar8 + lVar13 * 4 + -3) = (short)lVar14 * 0x28 + 0x50;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    lVar14 = lVar14 + 1;
    pBVar8 = pBVar8 + 0x40;
  } while (lVar14 != 0x19);
  return;
}

Assistant:

static void RestartModel(CPpmd7 *p)
{
  unsigned i, k, m;

  memset(p->FreeList, 0, sizeof(p->FreeList));
  p->Text = p->Base + p->AlignOffset;
  p->HiUnit = p->Text + p->Size;
  p->LoUnit = p->UnitsStart = p->HiUnit - p->Size / 8 / UNIT_SIZE * 7 * UNIT_SIZE;
  p->GlueCount = 0;

  p->OrderFall = p->MaxOrder;
  p->RunLength = p->InitRL = -(Int32)((p->MaxOrder < 12) ? p->MaxOrder : 12) - 1;
  p->PrevSuccess = 0;

  p->MinContext = p->MaxContext = (CTX_PTR)(p->HiUnit -= UNIT_SIZE); /* AllocContext(p); */
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 256;
  p->MinContext->SummFreq = 256 + 1;
  p->FoundState = (CPpmd_State *)p->LoUnit; /* AllocUnits(p, PPMD_NUM_INDEXES - 1); */
  p->LoUnit += U2B(256 / 2);
  p->MinContext->Stats = REF(p->FoundState);
  for (i = 0; i < 256; i++)
  {
    CPpmd_State *s = &p->FoundState[i];
    s->Symbol = (Byte)i;
    s->Freq = 1;
    SetSuccessor(s, 0);
  }

  for (i = 0; i < 128; i++)
    for (k = 0; k < 8; k++)
    {
      UInt16 *dest = p->BinSumm[i] + k;
      UInt16 val = (UInt16)(PPMD_BIN_SCALE - kInitBinEsc[k] / (i + 2));
      for (m = 0; m < 64; m += 8)
        dest[m] = val;
    }
  
  for (i = 0; i < 25; i++)
    for (k = 0; k < 16; k++)
    {
      CPpmd_See *s = &p->See[i][k];
      s->Summ = (UInt16)((5 * i + 10) << (s->Shift = PPMD_PERIOD_BITS - 4));
      s->Count = 4;
    }
}